

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O1

void __thiscall xmrig::OclCnRunner::set(OclCnRunner *this,Job *job,uint8_t *blob)

{
  pointer ppCVar1;
  length_error *this_00;
  pointer ppCVar2;
  
  if (job->m_size < 0x7d) {
    blob[job->m_size] = '\x01';
    memset(blob + job->m_size + 1,0,0x7f - job->m_size);
    OclBaseRunner::enqueueWriteBuffer
              (&this->super_OclBaseRunner,(this->super_OclBaseRunner).m_input,1,0,0x80,blob);
    ppCVar1 = (this->m_branchKernels).
              super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppCVar2 = (this->m_branchKernels).
                   super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppCVar2 != ppCVar1;
        ppCVar2 = ppCVar2 + 1) {
      CnBranchKernel::setTarget(*ppCVar2,job->m_target);
    }
    Cn1Kernel::setExtraIters(this->m_cn1,job->m_extraIters);
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"job size too big");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_t xmrig::OclCnRunner::bufferSize() const
{
    return OclBaseRunner::bufferSize() +
           align(CnAlgo::CN_MEMORY * m_intensity) +
           align(200 * m_intensity) +
           (align(sizeof(cl_uint) * (m_intensity + 2)) * BRANCH_MAX);
}